

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretMain.c
# Opt level: O0

void Abc_FlowRetime_MarkBlocks(Abc_Ntk_t *pNtk)

{
  Flow_Data_t *pFVar1;
  int iVar2;
  uint uVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pObj;
  int i;
  Abc_Ntk_t *pNtk_local;
  
  if (pManMR->fIsForward == 0) {
    for (pObj._4_4_ = 0; iVar2 = Abc_NtkPiNum(pNtk), pObj._4_4_ < iVar2; pObj._4_4_ = pObj._4_4_ + 1
        ) {
      pAVar4 = Abc_NtkPi(pNtk,pObj._4_4_);
      *(uint *)&pAVar4->field_0x14 = *(uint *)&pAVar4->field_0x14 & 0xffffffef | 0x10;
    }
    for (pObj._4_4_ = 0; iVar2 = Vec_PtrSize(pNtk->vBoxes), pObj._4_4_ < iVar2;
        pObj._4_4_ = pObj._4_4_ + 1) {
      pAVar4 = Abc_NtkBox(pNtk,pObj._4_4_);
      iVar2 = Abc_ObjIsLatch(pAVar4);
      if (iVar2 != 0) {
        *(uint *)&pAVar4->field_0x14 = *(uint *)&pAVar4->field_0x14 & 0xffffffef | 0x10;
      }
    }
    for (pObj._4_4_ = 0; iVar2 = Abc_NtkPoNum(pNtk), pObj._4_4_ < iVar2; pObj._4_4_ = pObj._4_4_ + 1
        ) {
      pAVar4 = Abc_NtkPo(pNtk,pObj._4_4_);
      Abc_NtkMarkCone_rec(pAVar4,pManMR->fIsForward);
    }
    if (pManMR->fBlockConst != 0) {
      for (pObj._4_4_ = 0; iVar2 = Vec_PtrSize(pNtk->vObjs), pObj._4_4_ < iVar2;
          pObj._4_4_ = pObj._4_4_ + 1) {
        pAVar4 = Abc_NtkObj(pNtk,pObj._4_4_);
        if ((pAVar4 != (Abc_Obj_t *)0x0) &&
           (((iVar2 = Abc_NtkIsStrash(pNtk), iVar2 != 0 &&
             (iVar2 = Abc_AigNodeIsConst(pAVar4), iVar2 != 0)) ||
            ((iVar2 = Abc_NtkIsStrash(pNtk), iVar2 == 0 &&
             (iVar2 = Abc_NodeIsConst(pAVar4), iVar2 != 0)))))) {
          pFVar1 = pManMR->pDataArray;
          uVar3 = Abc_ObjId(pAVar4);
          *(ushort *)(pFVar1 + uVar3) = *(ushort *)(pFVar1 + uVar3) | 0x10;
        }
      }
    }
  }
  else {
    for (pObj._4_4_ = 0; iVar2 = Abc_NtkPoNum(pNtk), pObj._4_4_ < iVar2; pObj._4_4_ = pObj._4_4_ + 1
        ) {
      pAVar4 = Abc_NtkPo(pNtk,pObj._4_4_);
      *(uint *)&pAVar4->field_0x14 = *(uint *)&pAVar4->field_0x14 & 0xffffffef | 0x10;
    }
    for (pObj._4_4_ = 0; iVar2 = Vec_PtrSize(pNtk->vBoxes), pObj._4_4_ < iVar2;
        pObj._4_4_ = pObj._4_4_ + 1) {
      pAVar4 = Abc_NtkBox(pNtk,pObj._4_4_);
      iVar2 = Abc_ObjIsLatch(pAVar4);
      if (iVar2 != 0) {
        *(uint *)&pAVar4->field_0x14 = *(uint *)&pAVar4->field_0x14 & 0xffffffef | 0x10;
      }
    }
    for (pObj._4_4_ = 0; iVar2 = Abc_NtkPiNum(pNtk), pObj._4_4_ < iVar2; pObj._4_4_ = pObj._4_4_ + 1
        ) {
      pAVar4 = Abc_NtkPi(pNtk,pObj._4_4_);
      Abc_NtkMarkCone_rec(pAVar4,pManMR->fIsForward);
    }
  }
  for (pObj._4_4_ = 0; iVar2 = Vec_PtrSize(pNtk->vObjs), pObj._4_4_ < iVar2;
      pObj._4_4_ = pObj._4_4_ + 1) {
    pAVar4 = Abc_NtkObj(pNtk,pObj._4_4_);
    if ((pAVar4 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar4->field_0x14 >> 4 & 1) != 0)) {
      *(uint *)&pAVar4->field_0x14 = *(uint *)&pAVar4->field_0x14 & 0xffffffef;
      iVar2 = Abc_ObjIsLatch(pAVar4);
      if (iVar2 == 0) {
        pFVar1 = pManMR->pDataArray;
        uVar3 = Abc_ObjId(pAVar4);
        *(ushort *)(pFVar1 + uVar3) = *(ushort *)(pFVar1 + uVar3) | 0x10;
      }
    }
  }
  return;
}

Assistant:

void
Abc_FlowRetime_MarkBlocks( Abc_Ntk_t * pNtk ) {
  int i;
  Abc_Obj_t *pObj;

  if (pManMR->fIsForward){
    // --- forward retiming : block TFO of inputs    

    // mark the frontier
    Abc_NtkForEachPo( pNtk, pObj, i )
      pObj->fMarkA = 1;
    Abc_NtkForEachLatch( pNtk, pObj, i )
      {
        pObj->fMarkA = 1;
      }
    // mark the nodes reachable from the PIs
    Abc_NtkForEachPi( pNtk, pObj, i )
      Abc_NtkMarkCone_rec( pObj, pManMR->fIsForward );
  } else {
    // --- backward retiming : block TFI of outputs

    // mark the frontier
    Abc_NtkForEachPi( pNtk, pObj, i )
      pObj->fMarkA = 1;
    Abc_NtkForEachLatch( pNtk, pObj, i )
      {
        pObj->fMarkA = 1;
      }
    // mark the nodes reachable from the POs
    Abc_NtkForEachPo( pNtk, pObj, i )
      Abc_NtkMarkCone_rec( pObj, pManMR->fIsForward );
    // block constant nodes (if enabled)
    if (pManMR->fBlockConst) {
      Abc_NtkForEachObj( pNtk, pObj, i )
        if ((Abc_NtkIsStrash(pNtk) && Abc_AigNodeIsConst(pObj)) ||
            (!Abc_NtkIsStrash(pNtk) && Abc_NodeIsConst(pObj))) {
          FSET(pObj, BLOCK);
        }
    }
  }

  // copy marks
  Abc_NtkForEachObj( pNtk, pObj, i ) {
    if (pObj->fMarkA) {
      pObj->fMarkA = 0;
      if (!Abc_ObjIsLatch(pObj) /* && !Abc_ObjIsPi(pObj) */ )
        FSET(pObj, BLOCK);
    }
  }
}